

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseObject
               (SnapObject *snpObject,bool readSeparator,FileReader *reader,SlabAllocator *alloc,
               SnapObjectVTable *vtable,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *ptrIdToTypeMap)

{
  SnapHandler *pSVar1;
  bool bVar2;
  SnapObjectType SVar3;
  int iVar4;
  uint uVar5;
  uint32 uVar6;
  TTD_PTR_ID TVar7;
  undefined4 extraout_var;
  Entry *pEVar8;
  DependsOnInfo *pDVar9;
  unsigned_long *puVar10;
  undefined4 extraout_var_00;
  void **ppvVar11;
  TTDVar pvVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  TVar7 = FileReader::ReadAddr(reader,objectId,false);
  snpObject->ObjectPtrId = TVar7;
  (*reader->_vptr_FileReader[3])(reader,0x22,1);
  SVar3 = (*reader->_vptr_FileReader[0x12])(reader,0);
  snpObject->SnapObjectTag = SVar3;
  iVar4 = (*reader->_vptr_FileReader[10])(reader,0x19,1);
  snpObject->OptWellKnownToken = (TTD_WELLKNOWN_TOKEN)0x0;
  if ((char)iVar4 != '\0') {
    (*reader->_vptr_FileReader[3])(reader,0x1a,1);
    iVar4 = (*reader->_vptr_FileReader[0x15])(reader,alloc,0);
    snpObject->OptWellKnownToken = (TTD_WELLKNOWN_TOKEN)CONCAT44(extraout_var,iVar4);
  }
  TVar7 = FileReader::ReadAddr(reader,typeId,true);
  pEVar8 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::FindSlotForId<false>
                     (ptrIdToTypeMap,TVar7);
  snpObject->SnapType = pEVar8->Data;
  uVar5 = (*reader->_vptr_FileReader[10])(reader,0x1b,1);
  snpObject->IsCrossSite = uVar5 & 0xff;
  snpObject->OptDependsOnInfo = (DependsOnInfo *)0x0;
  iVar4 = (*reader->_vptr_FileReader[10])(reader,0x4d,1);
  if ((char)iVar4 != '\0') {
    pDVar9 = (DependsOnInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
    snpObject->OptDependsOnInfo = pDVar9;
    uVar6 = FileReader::ReadLengthValue(reader,true);
    snpObject->OptDependsOnInfo->DepOnCount = uVar6;
    puVar10 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,(ulong)uVar6);
    snpObject->OptDependsOnInfo->DepOnPtrArray = puVar10;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (snpObject->OptDependsOnInfo->DepOnCount != 0) {
      uVar13 = 0;
      do {
        iVar4 = (*reader->_vptr_FileReader[0x10])(reader,(ulong)(uVar13 != 0));
        pDVar9 = snpObject->OptDependsOnInfo;
        pDVar9->DepOnPtrArray[uVar13] = CONCAT44(extraout_var_00,iVar4);
        uVar13 = uVar13 + 1;
      } while (uVar13 < pDVar9->DepOnCount);
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  bVar2 = Js::DynamicType::Is(snpObject->SnapType->JsTypeId);
  if (bVar2) {
    pSVar1 = snpObject->SnapType->TypeHandlerInfo;
    TVar7 = FileReader::ReadAddr(reader,objectId,true);
    snpObject->OptIndexedObjectArray = TVar7;
    uVar6 = FileReader::ReadLengthValue(reader,true);
    snpObject->VarArrayCount = uVar6;
    if (pSVar1->MaxPropertyIndex == 0) {
      snpObject->VarArray = (TTDVar *)0x0;
    }
    else {
      ppvVar11 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar6);
      snpObject->VarArray = ppvVar11;
      FileReader::ReadSequenceStart_WDefaultKey(reader,true);
      if (pSVar1->MaxPropertyIndex != 0) {
        uVar13 = 0;
        do {
          if (pSVar1->PropertyInfoArray[uVar13].DataKind == Clear) {
            (*reader->_vptr_FileReader[8])(reader,(ulong)(uVar13 != 0));
          }
          else {
            (*reader->_vptr_FileReader[6])(reader,(ulong)(uVar13 != 0));
            FileReader::ReadUInt32(reader,pid,false);
            (*reader->_vptr_FileReader[3])(reader,3,1);
            pvVar12 = NSSnapValues::ParseTTDVar(false,reader);
            snpObject->VarArray[uVar13] = pvVar12;
            (*reader->_vptr_FileReader[7])(reader);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < pSVar1->MaxPropertyIndex);
      }
      (*reader->_vptr_FileReader[5])(reader);
    }
  }
  if (vtable[snpObject->SnapObjectTag].ParseAddtlInfoFunc != (fPtr_ParseAddtlInfo)0x0) {
    (*vtable[snpObject->SnapObjectTag].ParseAddtlInfoFunc)(snpObject,reader,alloc);
  }
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseObject(SnapObject* snpObject, bool readSeparator, FileReader* reader, SlabAllocator& alloc, const SnapObjectVTable* vtable, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& ptrIdToTypeMap)
        {
            reader->ReadRecordStart(readSeparator);

            snpObject->ObjectPtrId = reader->ReadAddr(NSTokens::Key::objectId);
            snpObject->SnapObjectTag = reader->ReadTag<SnapObjectType>(NSTokens::Key::objectType, true);

            bool hasWellKnownToken = reader->ReadBool(NSTokens::Key::isWellKnownToken, true);
            snpObject->OptWellKnownToken = TTD_INVALID_WELLKNOWN_TOKEN;
            if(hasWellKnownToken)
            {
                snpObject->OptWellKnownToken = reader->ReadWellKnownToken(NSTokens::Key::wellKnownToken, alloc, true);
            }

            snpObject->SnapType = ptrIdToTypeMap.LookupKnownItem(reader->ReadAddr(NSTokens::Key::typeId, true));

            snpObject->IsCrossSite = reader->ReadBool(NSTokens::Key::isCrossSite, true);

#if ENABLE_OBJECT_SOURCE_TRACKING
            reader->ReadKey(NSTokens::Key::originInfo, true);
            ParseDiagnosticOriginInformation(snpObject->DiagOriginInfo, false, reader);
#endif

            snpObject->OptDependsOnInfo = nullptr;
            bool isDepOn = reader->ReadBool(NSTokens::Key::isDepOn, true);
            if(isDepOn)
            {
                snpObject->OptDependsOnInfo = alloc.SlabAllocateStruct<DependsOnInfo>();

                snpObject->OptDependsOnInfo->DepOnCount = reader->ReadLengthValue(true);
                snpObject->OptDependsOnInfo->DepOnPtrArray = alloc.SlabAllocateArray<TTD_PTR_ID>(snpObject->OptDependsOnInfo->DepOnCount);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < snpObject->OptDependsOnInfo->DepOnCount; ++i)
                {
                    snpObject->OptDependsOnInfo->DepOnPtrArray[i] = reader->ReadNakedAddr(i != 0);
                }
                reader->ReadSequenceEnd();
            }

            if(Js::DynamicType::Is(snpObject->SnapType->JsTypeId))
            {
                const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;

                snpObject->OptIndexedObjectArray = reader->ReadAddr(NSTokens::Key::objectId, true);

                snpObject->VarArrayCount = reader->ReadLengthValue(true);
                if(handler->MaxPropertyIndex == 0)
                {
                    snpObject->VarArray = nullptr;
                }
                else
                {
                    snpObject->VarArray = alloc.SlabAllocateArray<TTDVar>(snpObject->VarArrayCount);

                    reader->ReadSequenceStart_WDefaultKey(true);
                    for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
                    {
                        bool readVarSeparator = i != 0;

                        if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Clear)
                        {
                            reader->ReadNakedNull(readVarSeparator);
                        }
                        else
                        {
#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            reader->ReadRecordStart(readVarSeparator);
                            reader->ReadUInt32(NSTokens::Key::pid);
                            reader->ReadKey(NSTokens::Key::entry, true);

                            readVarSeparator = false;
#endif

                            snpObject->VarArray[i] = NSSnapValues::ParseTTDVar(readVarSeparator, reader);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
                            reader->ReadRecordEnd();
#endif
                        }
                    }
                    reader->ReadSequenceEnd();
                }
            }

            fPtr_ParseAddtlInfo addtlInfoParse = vtable[(uint32)snpObject->SnapObjectTag].ParseAddtlInfoFunc;
            if(addtlInfoParse != nullptr)
            {
                addtlInfoParse(snpObject, reader, alloc);
            }

            reader->ReadRecordEnd();
        }